

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSTLImportExport.cpp
# Opt level: O0

void __thiscall
utSTLImporterExporter_test_multiple_Test::~utSTLImporterExporter_test_multiple_Test
          (utSTLImporterExporter_test_multiple_Test *this)

{
  utSTLImporterExporter_test_multiple_Test *this_local;
  
  ~utSTLImporterExporter_test_multiple_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(utSTLImporterExporter, test_multiple) {
    // import same file twice, each with its own importer
    // must work both times and not crash
    Assimp::Importer importer1;
    const aiScene *scene1 = importer1.ReadFile( ASSIMP_TEST_MODELS_DIR "/STL/Spider_ascii.stl", aiProcess_ValidateDataStructure );
    EXPECT_NE(nullptr, scene1);

    Assimp::Importer importer2;
    const aiScene *scene2 = importer2.ReadFile( ASSIMP_TEST_MODELS_DIR "/STL/Spider_ascii.stl", aiProcess_ValidateDataStructure );
    EXPECT_NE(nullptr, scene2);
}